

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

char * strdup_rpl(char *str)

{
  size_t __n;
  void *__dest;
  char *pcVar1;
  
  __n = strlen(str);
  __dest = calloc(__n + 1,1);
  if (__dest != (void *)0x0) {
    pcVar1 = (char *)memcpy(__dest,str,__n);
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

static char* strdup_rpl(const char *str)
{
    size_t l = strlen(str);
    char *s = (char*)calloc(l + 1, sizeof(char));
    if(!s) {
        return NULL;
    }
    (void)memcpy(s, str, l);
    return s;
}